

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int copy_tag(char *buf,size_t buf_len,char *end_tag,FILE *file)

{
  int iVar1;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  size_t i;
  size_t in_stack_00000030;
  void *in_stack_00000038;
  ulong local_30;
  int local_4;
  
  do {
    iVar1 = file_read(in_stack_00000038,in_stack_00000030,(FILE *)buf);
    if (iVar1 == 0) {
      return 0;
    }
  } while (*in_RDI == ' ');
  if (*in_RDI == '\n') {
    *in_RDI = '\0';
    *in_RDX = '\n';
    local_4 = 1;
  }
  else {
    for (local_30 = 1; local_30 < in_RSI; local_30 = local_30 + 1) {
      iVar1 = file_read(in_stack_00000038,in_stack_00000030,(FILE *)buf);
      if (iVar1 == 0) {
        return 0;
      }
      if ((in_RDI[local_30] == ' ') || (in_RDI[local_30] == '\n')) break;
    }
    if (local_30 == in_RSI) {
      fprintf(_stderr,"Error: Y4M header tags must be less than %lu characters\n",local_30);
      local_4 = 0;
    }
    else {
      *in_RDX = in_RDI[local_30];
      in_RDI[local_30] = '\0';
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int copy_tag(char *buf, size_t buf_len, char *end_tag, FILE *file) {
  size_t i;
  assert(buf_len >= 1);
  // Skip leading space characters.
  do {
    if (!file_read(buf, 1, file)) {
      return 0;
    }
  } while (buf[0] == ' ');

  // If we hit the newline, treat this as the "empty" tag.
  if (buf[0] == '\n') {
    buf[0] = '\0';
    *end_tag = '\n';
    return 1;
  }

  // Copy over characters until a space is hit, or the buffer is exhausted.
  for (i = 1; i < buf_len; ++i) {
    if (!file_read(buf + i, 1, file)) {
      return 0;
    }
    if (buf[i] == ' ' || buf[i] == '\n') {
      break;
    }
  }
  if (i == buf_len) {
    fprintf(stderr, "Error: Y4M header tags must be less than %lu characters\n",
            (unsigned long)i);
    return 0;
  }
  *end_tag = buf[i];
  buf[i] = '\0';
  return 1;
}